

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O2

DependencyInfo *
duckdb::DependencyInfo::FromDependent(DependencyInfo *__return_storage_ptr__,DependencyEntry *dep)

{
  DependencyDependent *pDVar1;
  DependencySubject *pDVar2;
  
  pDVar1 = DependencyEntry::Dependent(dep);
  DependencyDependent::DependencyDependent(&__return_storage_ptr__->dependent,pDVar1);
  pDVar2 = DependencyEntry::Subject(dep);
  DependencySubject::DependencySubject(&__return_storage_ptr__->subject,pDVar2);
  return __return_storage_ptr__;
}

Assistant:

DependencyInfo DependencyInfo::FromDependent(DependencyEntry &dep) {
	return DependencyInfo {/*dependent = */ dep.Dependent(),
	                       /*subject = */ dep.Subject()};
}